

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6acc::VECTOR_DIM_DIM_2_Test::TestBody(VECTOR_DIM_DIM_2_Test *this)

{
  allocator<std::vector<int,_std::allocator<int>_>_> *this_00;
  initializer_list<int> __l;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_00;
  bool bVar1;
  char *message;
  vector<int,_std::allocator<int>_> *local_d8;
  AssertHelper local_b8;
  Message local_b0;
  int local_a4;
  size_type local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  allocator<int> local_75;
  int local_74 [3];
  iterator local_68;
  size_type local_60;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,_std::allocator<int>_> local_50;
  undefined1 local_38 [24];
  type v;
  VECTOR_DIM_DIM_2_Test *this_local;
  
  gtest_ar.message_.ptr_._3_1_ = 1;
  local_74[0] = 1;
  local_74[1] = 2;
  local_74[2] = 3;
  local_68 = local_74;
  local_60 = 3;
  local_58 = &local_50;
  v.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<int>::allocator(&local_75);
  __l._M_len = local_60;
  __l._M_array = local_68;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,&local_75);
  gtest_ar.message_.ptr_._3_1_ = 0;
  local_38._0_8_ = &local_50;
  local_38._8_8_ = (pointer)0x1;
  this_00 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
            ((long)&gtest_ar.message_.ptr_ + 2);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(this_00);
  __l_00._M_len = local_38._8_8_;
  __l_00._M_array = (iterator)local_38._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_38 + 0x10),__l_00,this_00);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&gtest_ar.message_.ptr_ + 2));
  local_d8 = (vector<int,_std::allocator<int>_> *)local_38;
  do {
    local_d8 = local_d8 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_d8);
  } while (local_d8 != &local_50);
  std::allocator<int>::~allocator(&local_75);
  local_a0 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)(local_38 + 0x10));
  local_a4 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_98,"v.size()","1",&local_a0,&local_a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x1b,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_38 + 0x10));
  return;
}

Assistant:

TEST(VECTOR_DIM, DIM_2) {
        vector_dim<int, 2>::type v = {{1,2,3}};
        EXPECT_EQ(v.size(), 1);
    }